

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Double_Window.cxx
# Opt level: O0

void __thiscall
Fl_Graphics_Driver::copy_offscreen
          (Fl_Graphics_Driver *this,int x,int y,int w,int h,Fl_Offscreen pixmap,int srcx,int srcy)

{
  Window WVar1;
  Fl_Surface_Device *pFVar2;
  Fl_Display_Device *pFVar3;
  uchar *buf;
  uchar *img;
  Fl_Surface_Device *_ss;
  Window _sw;
  Fl_Offscreen pixmap_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  Fl_Graphics_Driver *this_local;
  
  WVar1 = fl_window;
  fl_window = pixmap;
  pFVar2 = Fl_Surface_Device::surface();
  pFVar3 = Fl_Display_Device::display_device();
  (*(pFVar3->super_Fl_Surface_Device).super_Fl_Device._vptr_Fl_Device[3])();
  fl_push_no_clip();
  buf = fl_read_image((uchar *)0x0,srcx,srcy,w,h,0);
  fl_pop_clip();
  fl_window = WVar1;
  (*(pFVar2->super_Fl_Device)._vptr_Fl_Device[3])();
  fl_draw_image(buf,x,y,w,h,3,0);
  if (buf != (uchar *)0x0) {
    operator_delete__(buf);
  }
  return;
}

Assistant:

void Fl_Graphics_Driver::copy_offscreen(int x, int y, int w, int h, Fl_Offscreen pixmap, int srcx, int srcy)
{
  fl_begin_offscreen(pixmap);
  uchar *img = fl_read_image(NULL, srcx, srcy, w, h, 0);
  fl_end_offscreen();
  fl_draw_image(img, x, y, w, h, 3, 0);
  delete[] img;
}